

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sequence_kernel_c.h
# Opt level: O1

int __thiscall
dlib::
sequence_kernel_c<dlib::sequence_kernel_2<std::unique_ptr<dlib::toggle_button,_std::default_delete<dlib::toggle_button>_>,_dlib::memory_manager_stateless_kernel_1<char>_>_>
::remove(sequence_kernel_c<dlib::sequence_kernel_2<std::unique_ptr<dlib::toggle_button,_std::default_delete<dlib::toggle_button>_>,_dlib::memory_manager_stateless_kernel_1<char>_>_>
         *this,char *__filename)

{
  int iVar1;
  undefined4 extraout_var;
  ostream *poVar2;
  fatal_error *this_00;
  ostringstream dlib_o_out;
  string sStack_1b8;
  undefined1 local_198 [376];
  
  iVar1 = (*(this->
            super_sequence_kernel_2<std::unique_ptr<dlib::toggle_button,_std::default_delete<dlib::toggle_button>_>,_dlib::memory_manager_stateless_kernel_1<char>_>
            ).
            super_enumerable<std::unique_ptr<dlib::toggle_button,_std::default_delete<dlib::toggle_button>_>_>
            ._vptr_enumerable[8])();
  if (__filename < (char *)CONCAT44(extraout_var,iVar1)) {
    iVar1 = sequence_kernel_2<std::unique_ptr<dlib::toggle_button,_std::default_delete<dlib::toggle_button>_>,_dlib::memory_manager_stateless_kernel_1<char>_>
            ::remove(&this->
                      super_sequence_kernel_2<std::unique_ptr<dlib::toggle_button,_std::default_delete<dlib::toggle_button>_>,_dlib::memory_manager_stateless_kernel_1<char>_>
                     ,__filename);
    return iVar1;
  }
  std::__cxx11::ostringstream::ostringstream((ostringstream *)local_198);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)local_198,"\n\nError detected at line ",0x19);
  poVar2 = (ostream *)std::ostream::operator<<(local_198,0x87);
  std::__ostream_insert<char,std::char_traits<char>>(poVar2,".\n",2);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)local_198,"Error detected in file ",0x17);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)local_198,
             "/workspace/llm4binary/github/license_all_cmakelists_25/e-fominov[P]dlib/dlib/gui_widgets/../image_transforms/../statistics/../optimization/../sequence/sequence_kernel_c.h"
             ,0xaa);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_198,".\n",2);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)local_198,"Error detected in function ",0x1b);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)local_198,
             "void dlib::sequence_kernel_c<dlib::sequence_kernel_2<std::unique_ptr<dlib::toggle_button>>>::remove(unsigned long, T &) [seq_base = dlib::sequence_kernel_2<std::unique_ptr<dlib::toggle_button>>]"
             ,0xc2);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_198,".\n\n",3);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)local_198,"Failing expression was ",0x17);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)local_198,"( pos < this->size() )",0x16);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_198,".\n",2);
  *(uint *)(*(_func_int **)(local_198._0_8_ + -0x18) + (long)(local_198 + 0x18)) =
       *(uint *)(*(_func_int **)(local_198._0_8_ + -0x18) + (long)(local_198 + 0x18)) | 1;
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)local_198,"\tvoid sequence::remove",0x16);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)local_198,"\n\tpos must be >= 0 and < size()",0x1f);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_198,"\n\tpos: ",7);
  poVar2 = std::ostream::_M_insert<unsigned_long>((ulong)local_198);
  std::__ostream_insert<char,std::char_traits<char>>(poVar2,"\n\tsize(): ",10);
  (*(this->
    super_sequence_kernel_2<std::unique_ptr<dlib::toggle_button,_std::default_delete<dlib::toggle_button>_>,_dlib::memory_manager_stateless_kernel_1<char>_>
    ).
    super_enumerable<std::unique_ptr<dlib::toggle_button,_std::default_delete<dlib::toggle_button>_>_>
    ._vptr_enumerable[8])(this);
  poVar2 = std::ostream::_M_insert<unsigned_long>((ulong)poVar2);
  std::__ostream_insert<char,std::char_traits<char>>(poVar2,"\n\tthis: ",8);
  poVar2 = std::ostream::_M_insert<void_const*>(poVar2);
  std::__ostream_insert<char,std::char_traits<char>>(poVar2,"\n",1);
  this_00 = (fatal_error *)__cxa_allocate_exception(0x30);
  std::__cxx11::stringbuf::str();
  fatal_error::fatal_error(this_00,EBROKEN_ASSERT,&sStack_1b8);
  __cxa_throw(this_00,&fatal_error::typeinfo,error::~error);
}

Assistant:

void sequence_kernel_c<seq_base>::
    remove (
        unsigned long pos,
        T& item
    )
    {
        // make sure requires clause is not broken
        DLIB_CASSERT(( pos < this->size() ), 
                "\tvoid sequence::remove"
                << "\n\tpos must be >= 0 and < size()" 
                << "\n\tpos: " << pos 
                << "\n\tsize(): " << this->size()
                << "\n\tthis: " << this
        );

        // call the real function
        seq_base::remove(pos,item);

    }